

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

bool __thiscall
duckdb::BitpackingState<unsigned_char,_signed_char>::Flush<duckdb::EmptyBitpackingWriter>
          (BitpackingState<unsigned_char,_signed_char> *this)

{
  char cVar1;
  byte bVar2;
  uchar uVar3;
  uchar *puVar4;
  int iVar5;
  uint8_t right;
  bool bVar6;
  unsigned_long uVar7;
  idx_t iVar8;
  uint8_t left;
  ulong uVar9;
  bool bVar10;
  byte bVar11;
  ulong uVar12;
  
  bVar10 = true;
  if (this->compression_buffer_idx == 0) {
    return true;
  }
  if (this->all_invalid == false) {
    right = this->minimum;
    left = this->maximum;
    if (left != right) goto LAB_017257ce;
  }
  if ((byte)(this->mode - AUTO) < 2) {
    this->total_size = this->total_size + 5;
    return true;
  }
  right = this->minimum;
  left = this->maximum;
LAB_017257ce:
  bVar6 = TrySubtractOperator::Operation<unsigned_char,unsigned_char,unsigned_char>
                    (left,right,&this->min_max_diff);
  this->can_do_for = bVar6;
  CalculateDeltaStats(this);
  if (this->can_do_delta == true) {
    cVar1 = this->minimum_delta;
    if ((this->mode & ~AUTO) != DELTA_FOR && this->maximum_delta == cVar1) {
      this->total_size = this->total_size + 6;
      return true;
    }
    bVar2 = this->min_max_delta_diff;
    iVar5 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    bVar11 = 8 - ((byte)iVar5 ^ 7);
    if (bVar2 == 0) {
      bVar11 = 0;
    }
    bVar2 = this->min_max_diff;
    iVar5 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    if ((this->mode != FOR && bVar2 != 0) && bVar11 < (byte)(8 - ((byte)iVar5 ^ 7))) {
      if (this->compression_buffer_idx == 0) {
        iVar8 = this->total_size + 10;
        uVar12 = 0;
      }
      else {
        uVar9 = 0;
        do {
          this->delta_buffer[uVar9] = this->delta_buffer[uVar9] - cVar1;
          uVar9 = uVar9 + 1;
          uVar12 = this->compression_buffer_idx;
        } while (uVar9 < uVar12);
        iVar8 = this->total_size + 10;
        this->total_size = iVar8;
        if ((uVar12 & 0x1f) != 0) {
          uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar12 & 0x1f);
          uVar12 = (uVar12 - uVar7) + 0x20;
          iVar8 = this->total_size;
        }
      }
      this->total_size = (bVar11 * uVar12 >> 3) + iVar8;
      return true;
    }
  }
  if (this->can_do_for == true) {
    bVar2 = this->min_max_diff;
    iVar5 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> iVar5 == 0; iVar5 = iVar5 + -1) {
      }
    }
    bVar11 = 8 - ((byte)iVar5 ^ 7);
    if (bVar2 == 0) {
      bVar11 = 0;
    }
    if (this->compression_buffer_idx == 0) {
      uVar12 = 0;
    }
    else {
      puVar4 = this->compression_buffer;
      uVar3 = this->minimum;
      uVar9 = 0;
      do {
        puVar4[uVar9] = puVar4[uVar9] - uVar3;
        uVar9 = uVar9 + 1;
        uVar12 = this->compression_buffer_idx;
      } while (uVar9 < uVar12);
      if ((uVar12 & 0x1f) != 0) {
        uVar7 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)uVar12 & 0x1f);
        uVar12 = (uVar12 - uVar7) + 0x20;
      }
    }
    this->total_size = (bVar11 * uVar12 >> 3) + this->total_size + 9;
  }
  else {
    bVar10 = false;
  }
  return bVar10;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}